

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

void __thiscall soul::ValuePrinter::printStringLiteral(ValuePrinter *this,Handle h)

{
  StringDictionary *pSVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  long *plVar5;
  long *plVar6;
  uint uVar7;
  long extraout_RDX;
  ulong uVar8;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  long *local_40 [2];
  long local_30 [2];
  
  uVar8 = (ulong)h.handle;
  pSVar1 = this->dictionary;
  if (pSVar1 == (StringDictionary *)0x0) {
    cVar3 = '\x01';
    if (9 < h.handle) {
      cVar2 = '\x04';
      do {
        cVar3 = cVar2;
        uVar7 = (uint)uVar8;
        if (uVar7 < 100) {
          cVar3 = cVar3 + -2;
          goto LAB_001a498a;
        }
        if (uVar7 < 1000) {
          cVar3 = cVar3 + -1;
          goto LAB_001a498a;
        }
        if (uVar7 < 10000) goto LAB_001a498a;
        uVar8 = uVar8 / 10000;
        cVar2 = cVar3 + '\x04';
      } while (99999 < uVar7);
      cVar3 = cVar3 + '\x01';
    }
LAB_001a498a:
    local_80 = &local_70;
    std::__cxx11::string::_M_construct((ulong)&local_80,cVar3);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_80,(uint)local_78,h.handle);
  }
  else {
    iVar4 = (*(pSVar1->super_StringDictionary)._vptr_StringDictionary[3])(pSVar1,uVar8);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,extraout_RDX,CONCAT44(extraout_var,iVar4) + extraout_RDX);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x258626);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_50 = *plVar6;
      lStack_48 = plVar5[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar6;
      local_60 = (long *)*plVar5;
    }
    local_58 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_60);
    local_80 = &local_70;
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_70 = *plVar6;
      lStack_68 = plVar5[3];
    }
    else {
      local_70 = *plVar6;
      local_80 = (long *)*plVar5;
    }
    local_78 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
  }
  (*this->_vptr_ValuePrinter[0x13])(this,local_78,local_80);
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if ((pSVar1 != (StringDictionary *)0x0) && (local_40[0] != local_30)) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void ValuePrinter::printStringLiteral (StringDictionary::Handle h)
{
    print (dictionary != nullptr ? choc::text::addDoubleQuotes (std::string (dictionary->getStringForHandle (h)))
                                 : std::to_string (h.handle));
}